

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

size_t bc_slist_length(bc_slist_t *l)

{
  size_t sVar1;
  
  sVar1 = 0;
  for (; l != (bc_slist_t *)0x0; l = l->next) {
    sVar1 = sVar1 + 1;
  }
  return sVar1;
}

Assistant:

size_t
bc_slist_length(bc_slist_t *l)
{
    if (l == NULL)
        return 0;
    size_t i;
    bc_slist_t *tmp;
    for (tmp = l, i = 0; tmp != NULL; tmp = tmp->next, i++);
    return i;
}